

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

bool CoreML::Specification::GLMClassifier_PostEvaluationTransform_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 2;
}

Assistant:

bool GLMClassifier_PostEvaluationTransform_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}